

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txin_txinreference.cpp
# Opt level: O2

void __thiscall TxIn_Constractor_Test::~TxIn_Constractor_Test(TxIn_Constractor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(TxIn, Constractor) {
  {
    TxIn txin(exp_txid, exp_index, exp_sequence);
    EXPECT_EQ(txin.GetVout(), exp_index);
    EXPECT_EQ(txin.GetSequence(), exp_sequence);
    EXPECT_STREQ(txin.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  }

  {
    TxIn txin(exp_txid, exp_index, exp_sequence, exp_script);
    EXPECT_EQ(txin.GetVout(), exp_index);
    EXPECT_EQ(txin.GetSequence(), exp_sequence);
    EXPECT_STREQ(txin.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
    EXPECT_STREQ(txin.GetUnlockingScript().GetHex().c_str(),
                 exp_script.GetHex().c_str());
  }
}